

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntestc.cc
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  GlobalArray *this;
  uint __seed;
  uint uVar2;
  int iVar3;
  GlobalArray *pGVar4;
  int *procs;
  int *map;
  int *subscript;
  ulong uVar5;
  long lVar6;
  void *buf;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  int *piVar11;
  char *__s;
  uint uVar12;
  int ndim;
  GlobalArray *local_128;
  ulong local_120;
  int adims [4];
  int hi [4];
  int lo [4];
  int iStack_e4;
  int type;
  int ld [3];
  int block [4];
  double *ptr;
  int dims [4];
  int locdim [4];
  
  GA::Initialize(argc,argv,3000000,3000000,0x3f4,0);
  __seed = GA_Nodeid();
  uVar2 = GA_Nnodes();
  if (__seed == 0) {
    puts("Creating array A");
    fflush(_stdout);
  }
  iVar3 = 10;
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    dims[lVar8] = iVar3;
    iVar3 = iVar3 + 10;
  }
  pGVar4 = GA::GAServices::createGA((GAServices *)&GA::SERVICES,0x3f5,4,dims,"array A",(int *)0x0);
  if (__seed == 0) {
    puts("OK\n");
    printf("handle = %d\n",(ulong)(uint)pGVar4->mHandle);
    GA::GlobalArray::inquire(pGVar4,&type,&ndim,adims);
    puts("After Inquire");
  }
  else {
    GA::GlobalArray::inquire(pGVar4,&type,&ndim,adims);
  }
  GA::GlobalArray::printDistribution(pGVar4);
  GA::GAServices::sync((GAServices *)&GA::SERVICES);
  if (__seed == 0) {
    puts("\nReconstructing distribution description for A");
  }
  procs = (int *)malloc((long)(int)uVar2 * 4);
  if (procs == (int *)0x0) {
    GA_Error("malloc failed for proclist",0);
  }
  map = (int *)malloc((long)(int)uVar2 << 5);
  if (map == (int *)0x0) {
    GA_Error("malloc failed for regions",0);
  }
  uVar12 = ndim;
  local_120 = (ulong)uVar2;
  subscript = (int *)malloc((long)(int)(ndim + uVar2) << 2);
  if (subscript == (int *)0x0) {
    GA_Error("malloc failed for map",0);
    uVar12 = ndim;
  }
  uVar5 = 0;
  uVar7 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar7 = uVar5;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    lo[uVar5] = 0;
  }
  for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    hi[uVar5] = adims[uVar5] + -1;
  }
  uVar2 = GA::GlobalArray::locateRegion(pGVar4,lo,hi,map,procs);
  if ((int)uVar2 < 1) {
    GA_Error("error in NGA_Locate_region",uVar2);
  }
  uVar5 = 0;
  uVar7 = (ulong)(uint)ndim;
  if (ndim < 1) {
    uVar7 = uVar5;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    block[uVar5] = 0;
  }
  for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    adims[uVar5] = 0;
  }
  uVar9 = 0;
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = uVar9;
  }
  piVar11 = map + 4;
  uVar2 = 0;
  for (; uVar9 != uVar7; uVar9 = uVar9 + 1) {
    for (lVar8 = 0; uVar5 * 0x20 != lVar8; lVar8 = lVar8 + 0x20) {
      iVar3 = *(int *)((long)piVar11 + lVar8);
      if (adims[uVar9] < iVar3) {
        subscript[(int)uVar2] = *(int *)((long)piVar11 + lVar8 + -0x10);
        uVar2 = uVar2 + 1;
        block[uVar9] = block[uVar9] + 1;
        adims[uVar9] = iVar3;
      }
    }
    piVar11 = piVar11 + 1;
  }
  local_128 = pGVar4;
  if (__seed == 0) {
    printf("Distribution map contains %d elements\n",(ulong)uVar2);
    print_subscript("number of blocks for each dimension",ndim,block,"\n");
    print_subscript("distribution map",uVar2,subscript,"\n\n");
    fflush(_stdout);
    puts("Creating array B applying distribution of A");
  }
  pGVar4 = GA::GAServices::createGA
                     ((GAServices *)&GA::SERVICES,0x3f5,4,dims,"array B",block,subscript);
  if (pGVar4 == (GlobalArray *)0x0) {
    GA_Error("create failed: B",0);
  }
  this = local_128;
  if (__seed == 0) {
    puts("OK\n");
    free(procs);
    free(map);
    free(subscript);
    GA::GlobalArray::printDistribution(pGVar4);
    GA::GAServices::sync((GAServices *)&GA::SERVICES);
    puts("\nCompare distributions of A and B");
    iVar3 = GA::GlobalArray::compareDistr(this,pGVar4);
    __s = "Failure: distributions NOT identical";
    if (iVar3 == 0) {
      __s = "Success: distributions identical";
    }
    puts(__s);
    fflush(_stdout);
    puts("\nAccessing local elements of A: set them to the owner process id");
    fflush(_stdout);
  }
  else {
    free(procs);
    free(map);
    free(subscript);
    GA::GlobalArray::printDistribution(pGVar4);
    GA::GAServices::sync((GAServices *)&GA::SERVICES);
  }
  GA::GAServices::sync((GAServices *)&GA::SERVICES);
  GA::GlobalArray::distribution(this,__seed,lo,hi);
  uVar7 = local_120;
  if (-1 < hi[0]) {
    GA::GlobalArray::access(this,(char *)lo,(int)hi);
    uVar5 = 0;
    uVar9 = 0;
    if (0 < ndim) {
      uVar9 = (ulong)(uint)ndim;
    }
    for (; uVar9 != uVar5; uVar5 = uVar5 + 1) {
      locdim[uVar5] = (hi[uVar5] - lo[uVar5]) + 1;
    }
    fillPatch(ptr,locdim,ld,ndim,(double)(int)__seed);
  }
  uVar2 = (uint)uVar7;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  for (uVar12 = 0; uVar2 != uVar12; uVar12 = uVar12 + 1) {
    if ((__seed == uVar12) && (-1 < hi[0])) {
      sprintf((char *)locdim,"%d: leading dimensions",(ulong)__seed);
      print_subscript((char *)locdim,ndim + -1,ld,"\n");
      fflush(_stdout);
    }
    GA::GAServices::sync((GAServices *)&GA::SERVICES);
  }
  GA::GAServices::sync((GAServices *)&GA::SERVICES);
  if (__seed == 0) {
    puts("\nRandomly checking the update using ga_get on array sections");
  }
  GA::GAServices::sync((GAServices *)&GA::SERVICES);
  srand(__seed);
  lVar6 = (long)ndim;
  iVar3 = adims[lVar6 + -1];
  iVar10 = iVar3 + -1;
  adims[lVar6 + 3] = iVar10;
  for (lVar8 = 1; lVar8 < lVar6 + -1; lVar8 = lVar8 + 1) {
    ld[lVar8] = 1;
  }
  (&iStack_e4)[lVar6] = iVar10;
  buf = malloc((long)iVar3 << 3);
  if (buf == (void *)0x0) {
    GA_Error("malloc failed for buf",0);
  }
  if ((int)__seed <=
      (int)((long)((ulong)(uint)((int)local_120 >> 0x1f) << 0x20 | local_120 & 0xffffffff) / 2)) {
    uVar7 = 0;
    while ((int)uVar7 != 10) {
      uVar5 = (ulong)ndim;
      hi[uVar5 + 3] = 0;
      local_120 = uVar7;
      for (lVar8 = 0; lVar8 < (int)uVar5 + -1; lVar8 = lVar8 + 1) {
        iVar3 = rand();
        hi[lVar8] = iVar3 % adims[lVar8];
        lo[lVar8] = iVar3 % adims[lVar8];
        uVar5 = (ulong)(uint)ndim;
      }
      GA::GlobalArray::get(local_128,lo,hi,buf,ld);
      uVar7 = (ulong)(uint)ndim;
      for (lVar8 = 0; lVar8 < adims[(long)(int)uVar7 + -1]; lVar8 = lVar8 + 1) {
        uVar2 = GA::GlobalArray::locate(local_128,lo);
        dVar1 = *(double *)((long)buf + lVar8 * 8);
        if ((dVar1 != (double)(int)uVar2) || (NAN(dVar1) || NAN((double)(int)uVar2))) {
          sprintf((char *)locdim,"%d: wrong value: %d != %f a",(ulong)__seed,(ulong)uVar2);
          print_subscript((char *)locdim,ndim,lo,"\n");
          GA_Error("Error - bye",(int)lVar8);
        }
        uVar7 = (ulong)ndim;
        hi[uVar7 + 3] = hi[uVar7 + 3] + 1;
      }
      uVar7 = (ulong)((int)local_120 + 1);
    }
  }
  free(buf);
  GA::GAServices::sync((GAServices *)&GA::SERVICES);
  if (__seed == 0) {
    puts("OK");
    GA::GlobalArray::destroy(local_128);
    GA::GlobalArray::destroy(pGVar4);
    std::operator<<((ostream *)&std::cout,"Terminating\n");
  }
  else {
    GA::GlobalArray::destroy(local_128);
    GA::GlobalArray::destroy(pGVar4);
  }
  GA::Terminate();
  return 0;
}

Assistant:

int 
main(int argc, char *argv[]) {
 
  int me, nproc, proc, loop;
  int dims[NDIM], lo[NDIM], hi[NDIM], block[NDIM], ld[NDIM-1];
  int i,d,*proclist, offset;
  int adims[NDIM], ndim,type;
  typedef struct {
    int lo[NDIM];
    int hi[NDIM];
  } patch_t;
  patch_t *regions;
  int *map;
  double *buf;
  int heap  = 3000000, stack = 3000000;
  
  GA::Initialize(argc, argv, heap, stack, GA_DATA_TYPE, 0);
  me=GA_Nodeid(); nproc=GA_Nnodes();


  /***** create array A with default distribution  *****/
  if(me==0){printf("Creating array A\n"); fflush(stdout);}
  for(i = 0; i<NDIM; i++)
    dims[i] = N*(i+1);
  GA::GlobalArray *g_a = GA::SERVICES.createGA(MT_F_DBL, NDIM, dims, 
					       (char *)"array A", NULL);
  if(me==0)printf("OK\n\n");
  if(me==0)printf("handle = %d\n", g_a->handle());
  /* print info about array we got */
  g_a->inquire(&type, &ndim, adims);
  if(me==0)printf("After Inquire\n");
  g_a->printDistribution();

  GA::SERVICES.sync();
  /* duplicate array A with ga_create irreg rather than ga_duplicate
   * -- want to show distribution control 
   * -- with ga_duplicate it would be g_b=GA_Duplicate(g_a,name) 
   */
  if(me==0)printf("\nReconstructing distribution description for A\n");

  /* get memory for arrays describing distribution */
  proclist = (int*)malloc(nproc*sizeof(int));
  if(!proclist)GA_Error((char *)"malloc failed for proclist",0);
  regions = (patch_t*)malloc(nproc*sizeof(patch_t));
  if(!regions)GA_Error((char *)"malloc failed for regions",0);
  map = (int*)malloc((nproc+ndim)*sizeof(int)); /* ubound= nproc+mdim */
  if(!map)GA_Error((char *)"malloc failed for map",0);

  /* first find out how array g_a is distributed */
  for(i=0;i<ndim;i++)lo[i]=BASE;
  for(i=0;i<ndim;i++)hi[i]=adims[i] -1 + BASE;
  proc = g_a->locateRegion(lo, hi, (int*)regions, proclist);
  if(proc<1) GA_Error((char *)"error in NGA_Locate_region",proc);

  /* determine blocking for each dimension */
  for(i=0;i<ndim;i++)block[i]=0;
  for(i=0;i<ndim;i++)adims[i]=0;
     
  offset =0;
  for(d=0; d<ndim; d++)
    for(i=0;i<proc;i++)
      if( regions[i].hi[d]>adims[d] ){
	map[offset] = regions[i].lo[d];
	offset++;
	block[d]++;
	adims[d]= regions[i].hi[d];
      }
            
  if(me==0){
    printf("Distribution map contains %d elements\n",offset); 
    print_subscript((char *)"number of blocks for each dimension",
		    ndim,block,(char *)"\n");
    print_subscript((char *)"distribution map",offset,map,(char *)"\n\n");
    fflush(stdout);
  }
     
  if(me==0)printf("Creating array B applying distribution of A\n");

#    ifdef USE_DUPLICATE
  GA::GlobalArray *g_b = GA::SERVICES.createGA(g_a, "array B");
#    else
  GA::GlobalArray *g_b = GA::SERVICES.createGA(MT_F_DBL, NDIM, dims, 
					       (char *)"array B", block, map);
#    endif
  if(!g_b) GA_Error((char *)"create failed: B",0); 
  if(me==0)printf("OK\n\n");
  free(proclist); free(regions); free(map);
     
  g_b->printDistribution();

  GA::SERVICES.sync();

  if(me==0){
    printf("\nCompare distributions of A and B\n");
    if(g_a->compareDistr(g_b))
      printf("Failure: distributions NOT identical\n");
    else 
      printf("Success: distributions identical\n");
    fflush(stdout);
  }
       

  if(me==0){
    printf("\nAccessing local elements of A: set them to the owner process id\n");
    fflush(stdout);
  }
  GA::SERVICES.sync();

  g_a->distribution(me, lo, hi);

  if(hi[0]>=0){/* -1 means no elements stored on this processor */
    double *ptr;
    int locdim[NDIM];
    g_a->access(lo, hi, &ptr, ld);
    for(i=0;i<ndim;i++)locdim[i]=hi[i]-lo[i]+1;
    fillPatch(ptr, locdim, ld, ndim,(double)me);
  }

  for(i=0;i<nproc; i++){
    if(me==i && hi[0]>=0){
      char msg[100];
      sprintf(msg,(char *)"%d: leading dimensions",me);
      print_subscript(msg,ndim-1,ld,(char *)"\n");
      fflush(stdout);
    }
    GA::SERVICES.sync();
  }
     
  GA::SERVICES.sync();
  if(me==0)printf("\nRandomly checking the update using ga_get on array sections\n");
  GA::SERVICES.sync();

  /* show ga_get working and verify array updates 
   * every process does N random gets
   * for simplicity get only a single row at a time
   */
  srand(me); /* different seed for every process */
  hi[ndim-1]=adims[ndim-1] -1 + BASE;
  for(i=1;i<ndim-1; i++)ld[i]=1; ld[ndim-2]=adims[ndim-1] -1 + BASE;

  /* get buffer memory */
  buf = (double*)malloc(adims[ndim-1]*sizeof(double));
  if(!buf)GA_Error((char *)"malloc failed for buf",0);

  /* half of the processes check the result */
  if(me<=nproc/2) 
    for(loop = 0; loop< N; loop++){ /* task parallel loop */
      lo[ndim-1]=BASE;
      for (i= 0; i < ndim -1; i ++){
	lo[i] = hi[i] = rand()%adims[i]+BASE; 
      }

      /* print_subscript("getting",ndim,lo,"\n");*/
      g_a->get(lo, hi, buf, ld); 
         
      /* check values */
      for(i=0;i<adims[ndim-1]; i++){
	int p = g_a->locate(lo);
	if((double)p != buf[i]) {
	  char msg[100];
	  sprintf(msg,(char *)"%d: wrong value: %d != %f a",me, p, buf[i]);
	  print_subscript(msg,ndim,lo,(char *)"\n");
	  GA_Error((char *)"Error - bye",i);  
	}
	lo[ndim-1]++;
      }
    }
             
  free(buf);
  GA::SERVICES.sync();
           
  if(me==0)printf("OK\n");
     
  g_a->destroy();
  g_b->destroy();
  if(!me) cout << "Terminating\n";
  GA::Terminate();
}